

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

bool __thiscall
mpt::unique_array<mpt::item<mpt::layout::graph::axis>_>::resize
          (unique_array<mpt::item<mpt::layout::graph::axis>_> *this,long len)

{
  content<mpt::item<mpt::layout::graph::axis>_> *this_00;
  bool bVar1;
  
  bVar1 = reserve(this,len);
  if (bVar1) {
    bVar1 = true;
    if ((-1 < len) &&
       (this_00 = (this->_ref)._ref, this_00 != (content<mpt::item<mpt::layout::graph::axis>_> *)0x0
       )) {
      bVar1 = content<mpt::item<mpt::layout::graph::axis>_>::set_length(this_00,len);
      return bVar1;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool resize(long len)
	{
		if (!reserve(len)) {
			return false;
		}
		content<T> *d;
		if (len >= 0 && (d = _ref.instance())) {
			return d->set_length(len);
		}
		return true;
	}